

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O0

void __thiscall
gimage::BasicImageIO::load(BasicImageIO *this,ImageU8 *image,uint8 *data,size_t length)

{
  undefined8 uVar1;
  IOException *in_RCX;
  allocator local_41;
  string local_40 [24];
  string *in_stack_ffffffffffffffd8;
  
  uVar1 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"Loading from memory is not implemented",&local_41);
  gutil::IOException::IOException(in_RCX,in_stack_ffffffffffffffd8);
  __cxa_throw(uVar1,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
}

Assistant:

void BasicImageIO::load(ImageU8 &image, gutil::uint8 *data, size_t length) const
{
  throw gutil::IOException("Loading from memory is not implemented");
}